

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

void xm_tone_portamento(xm_context_t *ctx,xm_channel_context_t *ch)

{
  xm_frequency_type_t xVar1;
  uint32_t uVar2;
  byte bVar3;
  byte bVar4;
  long lVar5;
  uint32_t uVar6;
  uint uVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  fVar12 = ch->tone_portamento_target_period;
  if ((fVar12 != 0.0) || (NAN(fVar12))) {
    fVar11 = ch->period;
    if ((fVar11 != fVar12) || (NAN(fVar11) || NAN(fVar12))) {
      if (fVar11 <= fVar12) {
        if ((fVar12 <= fVar11) ||
           (fVar11 = (float)ch->tone_portamento_param *
                     *(float *)(&DAT_00107634 +
                               (ulong)((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) * 4) +
                     fVar11, ch->period = fVar11, fVar11 <= fVar12)) {
          fVar12 = ch->period;
          fVar13 = (float)ch->arp_note_offset;
          fVar11 = ch->vibrato_note_offset + ch->autovibrato_note_offset;
          xVar1 = (ctx->module).frequency_type;
          if (xVar1 == XM_AMIGA_FREQUENCIES) {
            if (ch->arp_note_offset == 0) {
              fVar12 = fVar11 * 16.0 + fVar12;
            }
            else {
              fVar12 = fVar12 * 1024.0;
              if (fVar12 <= 1753088.0) {
                bVar3 = 0;
                fVar9 = 876544.0;
                while (fVar12 < fVar9) {
                  bVar3 = bVar3 + 1;
                  fVar9 = (float)(int)(0xd6000 >> (bVar3 & 0x1f));
                }
              }
              else {
                bVar3 = 0;
                do {
                  bVar4 = 1 - bVar3;
                  bVar3 = bVar3 - 1;
                } while ((float)(uint)(0x1ac000 << (bVar4 & 0x1f)) < fVar12);
              }
              lVar5 = 0;
              uVar6 = 0x1ac000;
              do {
                uVar2 = amiga_frequencies[lVar5 + 1];
                if ((char)bVar3 < '\x01') {
                  uVar7 = uVar2;
                  uVar8 = uVar6;
                  if ((char)bVar3 < '\0') {
                    uVar7 = uVar2 << (-bVar3 & 0x1f);
                    uVar8 = uVar6 << (-bVar3 & 0x1f);
                  }
                }
                else {
                  uVar7 = (int)uVar2 >> (bVar3 & 0x1f);
                  uVar8 = (int)uVar6 >> (bVar3 & 0x1f);
                }
                fVar9 = (float)(int)uVar8;
                if (((float)(int)uVar7 <= fVar12) && (fVar12 <= fVar9)) {
                  fVar10 = (float)(int)(char)lVar5;
                  goto LAB_0010539b;
                }
                lVar5 = lVar5 + 1;
                uVar6 = uVar2;
              } while (lVar5 != 0xc);
              fVar10 = 0.0;
LAB_0010539b:
              if ((fVar9 < fVar12) || (fVar12 < (float)(int)uVar7)) {
                fprintf(_stderr,"%s(): %d <= %f <= %d should hold but doesn\'t, this is a bug\n",
                        (double)fVar12,"xm_frequency",(ulong)uVar7,(ulong)uVar8);
                fflush(_stderr);
              }
              fVar12 = xm_amiga_period((fVar12 - fVar9) / (float)(int)(uVar7 - uVar8) +
                                       (float)((char)bVar3 + 2) * 12.0 + fVar10 + fVar13);
              fVar12 = fVar11 * 16.0 + fVar12;
            }
            fVar9 = (float)(~-(uint)(fVar12 == 0.0) & (uint)(7093789.0 / (fVar12 + fVar12)));
          }
          else {
            fVar9 = 0.0;
            if (xVar1 == XM_LINEAR_FREQUENCIES) {
              fVar9 = exp2f((4608.0 - (fVar11 * -16.0 + fVar13 * -64.0 + fVar12)) / 768.0);
              fVar9 = fVar9 * 8363.0;
            }
          }
          ch->frequency = fVar9;
          ch->step = fVar9 / (float)ctx->rate;
          return;
        }
      }
      else {
        fVar11 = (float)ch->tone_portamento_param *
                 *(float *)(&DAT_0010763c +
                           (ulong)((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) * 4) +
                 fVar11;
        ch->period = fVar11;
        if (fVar12 <= fVar11) {
          xm_update_frequency(ctx,ch);
          return;
        }
      }
      ch->period = fVar12;
      xm_update_frequency(ctx,ch);
      return;
    }
  }
  return;
}

Assistant:

static void xm_tone_portamento(xm_context_t* ctx, xm_channel_context_t* ch) {
	/* 3xx called without a note, wait until we get an actual
	 * target note. */
	if(ch->tone_portamento_target_period == 0.f) return;

	if(ch->period != ch->tone_portamento_target_period) {
		XM_SLIDE_TOWARDS(ch->period,
		                 ch->tone_portamento_target_period,
		                 (ctx->module.frequency_type == XM_LINEAR_FREQUENCIES ?
		                  4.f : 1.f) * ch->tone_portamento_param
		);
		xm_update_frequency(ctx, ch);
	}
}